

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

const_iterator __thiscall
QMimeBinaryProvider::loadMimeTypeExtra(QMimeBinaryProvider *this,QString *mimeName)

{
  _Base_ptr this_00;
  _Rb_tree_header *p_Var1;
  char **this_01;
  int *piVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *data;
  char16_t *pcVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  QDebug *pQVar9;
  long lVar10;
  int __oflag;
  storage_type_conflict *psVar11;
  undefined8 uVar12;
  QString *pQVar13;
  long in_FS_OFFSET;
  QAnyStringView qualifiedName;
  QAnyStringView qualifiedName_00;
  QLatin1StringView other;
  QAnyStringView qualifiedName_01;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView str;
  QStringView rhs_03;
  QLatin1StringView lhs;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QLatin1StringView lhs_02;
  QStringView lhs_03;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_bool>
  pVar14;
  QStringView QVar15;
  QXmlStreamReader xml;
  QMessageLogger local_e8;
  QFile local_c8;
  QString local_b8;
  QString local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>,_std::_Select1st<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
          ::find(&(this->m_mimetypeExtra)._M_t,mimeName);
  p_Var1 = &(this->m_mimetypeExtra)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar8._M_node != p_Var1) goto LAB_004ab59b;
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar13 = &(this->super_QMimeProviderBase).m_directory;
  QString::toLower_helper(&local_b8,mimeName);
  local_78.a.b.d.size = local_b8.d.size;
  local_78.a.b.d.ptr = local_b8.d.ptr;
  pDVar3 = local_b8.d.d;
  local_b8.d.size = 0;
  local_78.a.a.b = L'/';
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (storage_type_conflict *)0x0;
  local_78.a.b.d.d._0_4_ = SUB84(pDVar3,0);
  local_78.a.b.d.d._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
  local_78.b.m_size = 4;
  local_78.b.m_data = ".xml";
  local_78.a.a.a = pQVar13;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>::
  convertTo<QString>(&local_98,&local_78);
  piVar2 = (int *)CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_),2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar6 = QFile::exists(&local_98);
  if (!bVar6) {
    local_78.a.a.b = L'/';
    local_78.a.b.d.ptr = (storage_type_conflict *)0x4;
    local_78.a.b.d.size = 0x5a544c;
    local_78.a.b.d.d = (Data *)mimeName;
    local_78.a.a.a = pQVar13;
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
    ::convertTo<QString>
              (&local_b8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
                *)&local_78);
    pcVar5 = local_98.d.ptr;
    data = local_98.d.d;
    qVar4 = local_b8.d.size;
    pDVar3 = local_b8.d.d;
    local_b8.d.d = local_98.d.d;
    local_98.d.d = pDVar3;
    local_98.d.ptr = local_b8.d.ptr;
    local_b8.d.ptr = pcVar5;
    local_b8.d.size = local_98.d.size;
    local_98.d.size = qVar4;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,2,0x10);
      }
    }
  }
  local_c8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_c8,&local_98);
  iVar7 = QFile::open(&local_c8,(char *)0x1,__oflag);
  if ((char)iVar7 != '\0') {
    pVar14 = std::
             map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
             ::try_emplace<>(&this->m_mimetypeExtra,mimeName);
    iVar8._M_node = (_Base_ptr)pVar14.first._M_node;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (storage_type_conflict *)0x0;
    local_b8.d.size = 0;
    local_e8.context.category = &DAT_aaaaaaaaaaaaaaaa;
    QXmlStreamReader::QXmlStreamReader
              ((QXmlStreamReader *)&local_e8.context.category,(QIODevice *)&local_c8);
    bVar6 = QXmlStreamReader::readNextStartElement((QXmlStreamReader *)&local_e8.context.category);
    if (!bVar6) {
LAB_004ab491:
      if ((_Base_ptr)local_b8.d.size != (_Base_ptr)0x0) {
        if ((iVar8._M_node[2]._M_left != (_Base_ptr)0x0) &&
           ((iVar8._M_node[2]._M_parent)->_M_left == (_Base_ptr)local_b8.d.size)) {
          rhs_03.m_data = local_b8.d.ptr;
          rhs_03.m_size = local_b8.d.size;
          lhs_03.m_data = (storage_type_conflict *)(iVar8._M_node[2]._M_parent)->_M_parent;
          lhs_03.m_size = local_b8.d.size;
          bVar6 = QtPrivate::equalStrings(lhs_03,rhs_03);
          if (bVar6) goto LAB_004ab4e1;
        }
        QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
                  ((QList<QString> *)(iVar8._M_node + 2),&local_b8);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)(iVar8._M_node + 2),0,&local_b8);
      }
LAB_004ab4e1:
      QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_e8.context.category);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QFile::~QFile(&local_c8);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_004ab59b;
    }
    QVar15 = QXmlStreamReader::name((QXmlStreamReader *)&local_e8.context.category);
    if (QVar15.m_size == 9) {
      QVar15.m_data = QVar15.m_data;
      QVar15.m_size = 9;
      lhs.m_data = "mime-type";
      lhs.m_size = 9;
      bVar6 = QtPrivate::equalStrings(lhs,QVar15);
      if (bVar6) {
        QXmlStreamReader::attributes
                  ((QXmlStreamAttributes *)&local_78,(QXmlStreamReader *)&local_e8.context.category)
        ;
        qualifiedName.m_size = 0x4000000000000004;
        qualifiedName.field_0.m_data_utf8 = "type";
        QVar15 = QXmlStreamAttributes::value((QXmlStreamAttributes *)&local_78,qualifiedName);
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                  ((QArrayDataPointer<QXmlStreamAttribute> *)&local_78);
        if (QVar15.m_size != 0) {
          uVar12 = 0;
          rhs.m_data = (mimeName->d).ptr;
          rhs.m_size = (mimeName->d).size;
          iVar7 = QtPrivate::compareStrings(QVar15,rhs,CaseInsensitive);
          if (iVar7 != 0) {
            local_78.a.a.a._0_4_ = 2;
            local_78.a.a.a._4_4_ = 0;
            local_78.a.a.b = L'\0';
            local_78.a.a._10_2_ = 0;
            local_78.a.a._12_4_ = 0;
            local_78.a.b.d.d._0_4_ = 0;
            local_78.a.b.d.d._4_4_ = 0;
            local_78.a.b.d.ptr = L"default";
            QMessageLogger::warning(&local_e8);
            pQVar9 = QDebug::operator<<((QDebug *)&local_e8,"Got name");
            pQVar9 = QDebug::operator<<(pQVar9,QVar15);
            pQVar9 = QDebug::operator<<(pQVar9,"in file");
            pQVar9 = QDebug::operator<<(pQVar9,&local_98);
            pQVar9 = QDebug::operator<<(pQVar9,"expected");
            QDebug::operator<<(pQVar9,mimeName);
            QDebug::~QDebug((QDebug *)&local_e8);
          }
          this_00 = iVar8._M_node + 2;
          this_01 = &local_e8.context.category;
          while( true ) {
            bVar6 = QXmlStreamReader::readNextStartElement((QXmlStreamReader *)this_01);
            if (!bVar6) break;
            QVar15 = QXmlStreamReader::name((QXmlStreamReader *)this_01);
            psVar11 = QVar15.m_data;
            lVar10 = QVar15.m_size;
            if (lVar10 == 4) {
              rhs_02.m_data = psVar11;
              rhs_02.m_size = 4;
              lhs_02.m_data = "glob";
              lhs_02.m_size = 4;
              bVar6 = QtPrivate::equalStrings(lhs_02,rhs_02);
              if (bVar6) {
                local_78.a.b.d.d._0_4_ = 0xaaaaaaaa;
                local_78.a.b.d.d._4_4_ = 0xaaaaaaaa;
                local_78.a.a.a._0_4_ = 0xaaaaaaaa;
                local_78.a.a.a._4_4_ = 0xaaaaaaaa;
                local_78.a.a.b = L'ꪪ';
                local_78.a.a._10_2_ = 0xaaaa;
                local_78.a.a._12_4_ = 0xaaaaaaaa;
                QXmlStreamReader::attributes
                          ((QXmlStreamAttributes *)&local_e8,(QXmlStreamReader *)this_01);
                qualifiedName_01.m_size = 0x4000000000000007;
                qualifiedName_01.field_0.m_data_utf8 = "pattern";
                QVar15 = QXmlStreamAttributes::value
                                   ((QXmlStreamAttributes *)&local_e8,qualifiedName_01);
                QString::QString((QString *)&local_78,(QChar *)QVar15.m_data,QVar15.m_size);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_e8);
                if (((_Base_ptr)local_b8.d.size == (_Base_ptr)0x0) &&
                   (bVar6 = QString::startsWith((QString *)&local_78,(QChar)0x2a,CaseSensitive),
                   bVar6)) {
                  QString::operator=(&local_b8,(QString *)&local_78);
                }
                str.m_size._2_2_ = local_78.a.a._10_2_;
                str.m_size._0_2_ = local_78.a.a.b;
                str.m_size._4_4_ = local_78.a.a._12_4_;
                str.m_data = (storage_type_conflict *)0x1;
                bVar6 = QtPrivate::QStringList_contains
                                  ((QtPrivate *)this_00,
                                   (QStringList *)
                                   CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_),str,
                                   (CaseSensitivity)uVar12);
                if (!bVar6) {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)this_00,
                             (qsizetype)iVar8._M_node[2]._M_left,(QString *)&local_78);
                  QList<QString>::end((QList<QString> *)this_00);
                }
                local_78.a.b.d.d = (Data *)CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_);
                if (local_78.a.a.a != (QString *)0x0) {
                  LOCK();
                  *(int *)&((local_78.a.a.a)->d).d = *(int *)&((local_78.a.a.a)->d).d + -1;
                  UNLOCK();
                  local_78.a.b.d.d = (Data *)CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_)
                  ;
                  if (*(int *)&((local_78.a.a.a)->d).d == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)CONCAT44(local_78.a.a.a._4_4_,local_78.a.a.a._0_4_),2,
                               0x10);
                  }
                }
              }
LAB_004ab484:
              QXmlStreamReader::skipCurrentElement((QXmlStreamReader *)this_01);
            }
            else {
              if (lVar10 == 0xe) {
                rhs_01.m_data = psVar11;
                rhs_01.m_size = 0xe;
                lhs_01.m_data = "glob-deleteall";
                lhs_01.m_size = 0xe;
                bVar6 = QtPrivate::equalStrings(lhs_01,rhs_01);
                if (bVar6) {
                  *(undefined1 *)&iVar8._M_node[2]._M_right = 1;
                }
                goto LAB_004ab484;
              }
              if (lVar10 != 7) goto LAB_004ab484;
              rhs_00.m_data = psVar11;
              rhs_00.m_size = 7;
              lhs_00.m_data = "comment";
              lhs_00.m_size = 7;
              bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00);
              if (!bVar6) goto LAB_004ab484;
              local_78.a.b.d.d._0_4_ = 0xaaaaaaaa;
              local_78.a.b.d.d._4_4_ = 0xaaaaaaaa;
              local_78.a.a.a._0_4_ = 0xaaaaaaaa;
              local_78.a.a.a._4_4_ = 0xaaaaaaaa;
              local_78.a.a.b = L'ꪪ';
              local_78.a.a._10_2_ = 0xaaaa;
              local_78.a.a._12_4_ = 0xaaaaaaaa;
              QXmlStreamReader::attributes
                        ((QXmlStreamAttributes *)&local_e8,(QXmlStreamReader *)this_01);
              qualifiedName_00.m_size = 0x4000000000000008;
              qualifiedName_00.field_0.m_data_utf8 = "xml:lang";
              QVar15 = QXmlStreamAttributes::value
                                 ((QXmlStreamAttributes *)&local_e8,qualifiedName_00);
              QString::QString((QString *)&local_78,(QChar *)QVar15.m_data,QVar15.m_size);
              QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                        ((QArrayDataPointer<QXmlStreamAttribute> *)&local_e8);
              local_e8.context.function = &DAT_aaaaaaaaaaaaaaaa;
              local_e8.context._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_e8.context.file = &DAT_aaaaaaaaaaaaaaaa;
              QXmlStreamReader::readElementText
                        ((QString *)&local_e8,(QXmlStreamReader *)this_01,ErrorOnUnexpectedElement);
              if (CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_) == 0) {
                other.m_data = "default";
                other.m_size = 7;
                QString::operator=((QString *)&local_78,other);
              }
              QHash<QString,QString>::emplace<QString_const&>
                        ((QHash<QString,QString> *)&iVar8._M_node[1]._M_right,(QString *)&local_78,
                         (QString *)&local_e8);
              if ((QArrayData *)local_e8.context._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_e8.context._0_8_)->_q_value).super___atomic_base<int>.
                _M_i = (((QBasicAtomicInt *)local_e8.context._0_8_)->_q_value).
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_e8.context._0_8_)->_q_value).super___atomic_base<int>
                    ._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_e8.context._0_8_,2,0x10);
                }
              }
              local_78.a.b.d.d = (Data *)CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_);
              if (local_78.a.a.a != (QString *)0x0) {
                LOCK();
                *(int *)&((local_78.a.a.a)->d).d = *(int *)&((local_78.a.a.a)->d).d + -1;
                UNLOCK();
                local_78.a.b.d.d = (Data *)CONCAT44(local_78.a.b.d.d._4_4_,local_78.a.b.d.d._0_4_);
                if (*(int *)&((local_78.a.a.a)->d).d == 0) {
                  QArrayData::deallocate
                            ((QArrayData *)CONCAT44(local_78.a.a.a._4_4_,local_78.a.a.a._0_4_),2,
                             0x10);
                }
              }
            }
          }
          goto LAB_004ab491;
        }
      }
    }
    QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_e8.context.category);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QFile::~QFile(&local_c8);
  iVar8._M_node = &p_Var1->_M_header;
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_004ab59b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (const_iterator)iVar8._M_node;
}

Assistant:

QMimeBinaryProvider::MimeTypeExtraMap::const_iterator
QMimeBinaryProvider::loadMimeTypeExtra(const QString &mimeName)
{
#if QT_CONFIG(xmlstreamreader)
    auto it = m_mimetypeExtra.find(mimeName);
    if (it == m_mimetypeExtra.cend()) {
        // load comment and globPatterns

        // shared-mime-info since 1.3 lowercases the xml files
        QString mimeFile = m_directory + u'/' + mimeName.toLower() + ".xml"_L1;
        if (!QFile::exists(mimeFile))
            mimeFile = m_directory + u'/' + mimeName + ".xml"_L1; // pre-1.3

        QFile qfile(mimeFile);
        if (!qfile.open(QFile::ReadOnly))
            return m_mimetypeExtra.cend();

        it = m_mimetypeExtra.try_emplace(mimeName).first;
        MimeTypeExtra &extra = it->second;
        QString mainPattern;

        QXmlStreamReader xml(&qfile);
        if (xml.readNextStartElement()) {
            if (xml.name() != "mime-type"_L1) {
                return m_mimetypeExtra.cend();
            }
            const auto name = xml.attributes().value("type"_L1);
            if (name.isEmpty())
                return m_mimetypeExtra.cend();
            if (name.compare(mimeName, Qt::CaseInsensitive))
                qWarning() << "Got name" << name << "in file" << mimeFile << "expected" << mimeName;

            while (xml.readNextStartElement()) {
                const auto tag = xml.name();
                if (tag == "comment"_L1) {
                    QString lang = xml.attributes().value("xml:lang"_L1).toString();
                    const QString text = xml.readElementText();
                    if (lang.isEmpty()) {
                        lang = "default"_L1; // no locale attribute provided, treat it as default.
                    }
                    extra.localeComments.insert(lang, text);
                    continue; // we called readElementText, so we're at the EndElement already.
                } else if (tag == "glob-deleteall"_L1) { // as written out by shared-mime-info >= 0.70
                    extra.hasGlobDeleteAll = true;
                } else if (tag == "glob"_L1) { // as written out by shared-mime-info >= 0.70
                    const QString pattern = xml.attributes().value("pattern"_L1).toString();
                    if (mainPattern.isEmpty() && pattern.startsWith(u'*')) {
                        mainPattern = pattern;
                    }
                    appendIfNew(extra.globPatterns, pattern);
                }
                xml.skipCurrentElement();
            }
            Q_ASSERT(xml.name() == "mime-type"_L1);
        }

        // Let's assume that shared-mime-info is at least version 0.70
        // Otherwise we would need 1) a version check, and 2) code for parsing patterns from the globs file.
        if (!mainPattern.isEmpty() &&
                (extra.globPatterns.isEmpty() || extra.globPatterns.constFirst() != mainPattern)) {
            // ensure it's first in the list of patterns
            extra.globPatterns.removeAll(mainPattern);
            extra.globPatterns.prepend(mainPattern);
        }
    }
    return it;
#else
    Q_UNUSED(mimeName);
    qWarning("Cannot load mime type since QXmlStreamReader is not available.");
    return m_mimetypeExtra.cend();
#endif // feature xmlstreamreader
}